

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vm.cpp
# Opt level: O1

AST * __thiscall
jsonnet::internal::anon_unknown_0::Interpreter::builtinObjectFieldsEx
          (Interpreter *this,LocationRange *loc,
          vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>
          *args)

{
  pointer pVVar1;
  HeapEntity *pHVar2;
  _Base_ptr p_Var3;
  HeapThunk *pHVar4;
  _Rb_tree_header *p_Var5;
  _Rb_tree_node_base *p_Var6;
  allocator_type *in_RCX;
  _Rb_tree_node_base *args_2;
  _Link_type __x;
  vector<jsonnet::internal::(anonymous_namespace)::Value::Type,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value::Type>_>
  *params;
  initializer_list<jsonnet::internal::(anonymous_namespace)::Value::Type> __l;
  Value VVar7;
  set<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>,_std::less<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>,_std::allocator<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>_>
  fields;
  HeapThunk *th;
  undefined4 local_ac;
  undefined1 local_a8 [32];
  _Rb_tree_node_base *local_88;
  size_t local_80;
  undefined1 local_78 [8];
  _Rb_tree_node_base _Stack_70;
  vector<jsonnet::internal::(anonymous_namespace)::Value::Type,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value::Type>_>
  local_48;
  
  local_a8._0_8_ = local_a8 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_a8,"objectFieldsEx","");
  local_78 = (undefined1  [8])0x100000012;
  __l._M_len = 2;
  __l._M_array = (iterator)local_78;
  std::
  vector<jsonnet::internal::(anonymous_namespace)::Value::Type,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value::Type>_>
  ::vector(&local_48,__l,in_RCX);
  params = &local_48;
  validateBuiltinArgs(this,loc,(string *)local_a8,args,params);
  if (local_48.
      super__Vector_base<jsonnet::internal::(anonymous_namespace)::Value::Type,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value::Type>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_48.
                    super__Vector_base<jsonnet::internal::(anonymous_namespace)::Value::Type,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value::Type>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_48.
                          super__Vector_base<jsonnet::internal::(anonymous_namespace)::Value::Type,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value::Type>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_48.
                          super__Vector_base<jsonnet::internal::(anonymous_namespace)::Value::Type,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value::Type>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if ((undefined1 *)local_a8._0_8_ != local_a8 + 0x10) {
    operator_delete((void *)local_a8._0_8_,local_a8._16_8_ + 1);
  }
  pVVar1 = (args->
           super__Vector_base<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>
           )._M_impl.super__Vector_impl_data._M_start;
  args_2 = (_Rb_tree_node_base *)(local_a8 + 8);
  local_a8._8_4_ = _S_red;
  local_a8._16_8_ = 0;
  local_80 = 0;
  local_a8._24_8_ = args_2;
  local_88 = args_2;
  objectFields((set<const_jsonnet::internal::Identifier_*,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<const_jsonnet::internal::Identifier_*>_>
                *)local_78,(Interpreter *)(pVVar1->v).h,(HeapObject *)(ulong)(pVVar1[1].v.b ^ 1),
               SUB81(args_2,0));
  if (_Stack_70._M_left != &_Stack_70) {
    p_Var3 = _Stack_70._M_left;
    do {
      std::
      _Rb_tree<std::__cxx11::u32string,std::__cxx11::u32string,std::_Identity<std::__cxx11::u32string>,std::less<std::__cxx11::u32string>,std::allocator<std::__cxx11::u32string>>
      ::_M_insert_unique<std::__cxx11::u32string_const&>
                ((_Rb_tree<std::__cxx11::u32string,std::__cxx11::u32string,std::_Identity<std::__cxx11::u32string>,std::less<std::__cxx11::u32string>,std::allocator<std::__cxx11::u32string>>
                  *)local_a8,
                 *(basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_> **)
                  (p_Var3 + 1));
      p_Var3 = (_Base_ptr)std::_Rb_tree_increment(p_Var3);
    } while (p_Var3 != &_Stack_70);
  }
  std::
  _Rb_tree<const_jsonnet::internal::Identifier_*,_const_jsonnet::internal::Identifier_*,_std::_Identity<const_jsonnet::internal::Identifier_*>,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<const_jsonnet::internal::Identifier_*>_>
  ::~_Rb_tree((_Rb_tree<const_jsonnet::internal::Identifier_*,_const_jsonnet::internal::Identifier_*,_std::_Identity<const_jsonnet::internal::Identifier_*>,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<const_jsonnet::internal::Identifier_*>_>
               *)local_78);
  local_78 = (undefined1  [8])0x0;
  _Stack_70._0_8_ = (pointer)0x0;
  _Stack_70._M_parent = (_Base_ptr)0x0;
  VVar7 = makeArray(this,(vector<jsonnet::internal::(anonymous_namespace)::HeapThunk_*,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>
                          *)local_78);
  (this->scratch).t = ARRAY;
  (this->scratch).v = VVar7._0_8_;
  if (local_78 != (undefined1  [8])0x0) {
    operator_delete((void *)local_78,(long)_Stack_70._M_parent - (long)local_78);
  }
  if ((_Rb_tree_node_base *)local_a8._24_8_ != (_Rb_tree_node_base *)(local_a8 + 8)) {
    pHVar2 = (this->scratch).v.h;
    p_Var6 = (_Rb_tree_node_base *)local_a8._24_8_;
    do {
      local_ac = 0;
      pHVar4 = (anonymous_namespace)::Interpreter::
               makeHeap<jsonnet::internal::(anonymous_namespace)::HeapThunk,jsonnet::internal::Identifier_const*&,decltype(nullptr),int,decltype(nullptr)>
                         ((Interpreter *)this,&this->idArrayElement,(void **)&local_ac,(int *)args_2
                          ,(void **)params);
      local_78 = (undefined1  [8])pHVar4;
      std::
      vector<jsonnet::internal::(anonymous_namespace)::HeapThunk_*,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>
      ::push_back((vector<jsonnet::internal::(anonymous_namespace)::HeapThunk_*,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>
                   *)(pHVar2 + 1),(value_type *)local_78);
      __x = (_Link_type)(p_Var6 + 1);
      VVar7 = makeString(this,(UString *)__x);
      (pHVar4->content).t = STRING;
      (pHVar4->content).v = VVar7._0_8_;
      (pHVar4->super_HeapEntity).field_0xa = 1;
      pHVar4->self = (HeapObject *)0x0;
      std::
      _Rb_tree<const_jsonnet::internal::Identifier_*,_std::pair<const_jsonnet::internal::Identifier_*const,_jsonnet::internal::(anonymous_namespace)::HeapThunk_*>,_std::_Select1st<std::pair<const_jsonnet::internal::Identifier_*const,_jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<std::pair<const_jsonnet::internal::Identifier_*const,_jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>_>
      ::_M_erase((_Rb_tree<const_jsonnet::internal::Identifier_*,_std::pair<const_jsonnet::internal::Identifier_*const,_jsonnet::internal::(anonymous_namespace)::HeapThunk_*>,_std::_Select1st<std::pair<const_jsonnet::internal::Identifier_*const,_jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<std::pair<const_jsonnet::internal::Identifier_*const,_jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>_>
                  *)(pHVar4->upValues)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent,__x);
      p_Var5 = &(pHVar4->upValues)._M_t._M_impl.super__Rb_tree_header;
      (pHVar4->upValues)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      (pHVar4->upValues)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var5->_M_header;
      (pHVar4->upValues)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var5->_M_header;
      (pHVar4->upValues)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
      p_Var6 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var6);
    } while (p_Var6 != (_Rb_tree_node_base *)(local_a8 + 8));
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>,_std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>,_std::_Identity<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>,_std::less<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>,_std::allocator<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>,_std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>,_std::_Identity<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>,_std::less<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>,_std::allocator<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>_>
               *)local_a8);
  return (AST *)0x0;
}

Assistant:

const AST *builtinObjectFieldsEx(const LocationRange &loc, const std::vector<Value> &args)
    {
        validateBuiltinArgs(loc, "objectFieldsEx", args, {Value::OBJECT, Value::BOOLEAN});
        const auto *obj = static_cast<HeapObject *>(args[0].v.h);
        bool include_hidden = args[1].v.b;
        // Stash in a set first to sort them.
        std::set<UString> fields;
        for (const auto &field : objectFields(obj, !include_hidden)) {
            fields.insert(field->name);
        }
        scratch = makeArray({});
        auto &elements = static_cast<HeapArray *>(scratch.v.h)->elements;
        for (const auto &field : fields) {
            auto *th = makeHeap<HeapThunk>(idArrayElement, nullptr, 0, nullptr);
            elements.push_back(th);
            th->fill(makeString(field));
        }
        return nullptr;
    }